

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  basic_node_ptr<unodb::detail::node_header> new_value;
  bool bVar1;
  uchar uVar2;
  int extraout_EAX;
  reference pvVar3;
  reference this_00;
  reference this_01;
  reference this_02;
  const_iterator __first;
  const_iterator pvVar4;
  byte in_CL;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *in_RDX;
  basic_node_ptr<unodb::detail::node_header> local_50;
  basic_node_ptr<unodb::detail::node_header> source_child_ptr;
  uint local_40;
  uint uStack_3c;
  uchar source_child_i;
  uint i;
  uint next_child;
  db_inode_reclaimable_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  uint8_t child_to_delete_local;
  inode48_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  
  reclaim_source_node._M_t.
  super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ._M_head_impl._7_1_ = in_CL;
  basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
  ::
  make_db_inode_reclaimable_ptr<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
              *)&i,(inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                   in_RDX,(db_type *)ctx);
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  ::remove_child_pointer
            (in_RDX,reclaim_source_node._M_t.
                    super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    .
                    super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                    ._M_head_impl._7_1_,(db_type *)ctx);
  pvVar3 = std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                     (&in_RDX->child_indexes,
                      (ulong)reclaim_source_node._M_t.
                             super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                             ._M_head_impl._7_1_);
  in_fake_critical_section<unsigned_char>::operator=(pvVar3,0xff);
  uStack_3c = 0;
  local_40 = 0;
  do {
    pvVar3 = std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                       (&in_RDX->child_indexes,(ulong)local_40);
    source_child_ptr.tagged_ptr._7_1_ = in_fake_critical_section<unsigned_char>::load(pvVar3);
    if (source_child_ptr.tagged_ptr._7_1_ != 0xff) {
      this_00 = std::array<unodb::in_fake_critical_section<std::byte>,_16UL>::operator[]
                          (&(this->keys).byte_array,(ulong)uStack_3c);
      in_fake_critical_section<std::byte>::operator=(this_00,(byte)local_40);
      this_01 = std::
                array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_48UL>
                ::operator[](&(in_RDX->children).pointer_array,
                             (ulong)source_child_ptr.tagged_ptr._7_1_);
      local_50 = in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                 ::load(this_01);
      bVar1 = basic_node_ptr<unodb::detail::node_header>::operator==(&local_50,(nullptr_t)0x0);
      new_value.tagged_ptr = local_50.tagged_ptr;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("source_child_ptr != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x713,
                      "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                     );
      }
      this_02 = std::
                array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_16UL>
                ::operator[](&this->children,(ulong)uStack_3c);
      in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::
      operator=(this_02,new_value);
      uStack_3c = uStack_3c + 1;
      if (uStack_3c == 0x10) {
        uVar2 = in_fake_critical_section::operator_cast_to_unsigned_char
                          ((in_fake_critical_section *)
                           &(this->
                            super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                            ).
                            super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                            .children_count);
        if (uVar2 != '\x10') {
          __assert_fail("this->children_count == basic_inode_16::capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                        ,0x71c,
                        "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                       );
        }
        __first = std::array<unodb::in_fake_critical_section<std::byte>,_16UL>::cbegin
                            (&(this->keys).byte_array);
        pvVar4 = std::array<unodb::in_fake_critical_section<std::byte>,_16UL>::cbegin
                           (&(this->keys).byte_array);
        bVar1 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>
                          (__first,pvVar4 + 0x10);
        if (bVar1) {
          std::
          unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&i);
          return extraout_EAX;
        }
        __assert_fail("std::is_sorted(keys.byte_array.cbegin(), keys.byte_array.cbegin() + basic_inode_16::capacity)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x71f,
                      "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                     );
      }
    }
    if (0xfe < local_40) {
      __assert_fail("i < 255",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x718,
                    "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                   );
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

constexpr void init(db_type &db_instance, inode48_type &source_node,
                      std::uint8_t child_to_delete) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode48_type>(
            &source_node, db_instance)};
    source_node.remove_child_pointer(child_to_delete, db_instance);
    source_node.child_indexes[child_to_delete] = inode48_type::empty_child;

    // TODO(laurynas): consider AVX2 gather?
    unsigned next_child = 0;
    unsigned i = 0;
    while (true) {
      const auto source_child_i = source_node.child_indexes[i].load();
      if (source_child_i != inode48_type::empty_child) {
        keys.byte_array[next_child] = static_cast<std::byte>(i);
        const auto source_child_ptr =
            source_node.children.pointer_array[source_child_i].load();
        UNODB_DETAIL_ASSERT(source_child_ptr != nullptr);
        children[next_child] = source_child_ptr;
        ++next_child;
        if (next_child == basic_inode_16::capacity) break;
      }
      UNODB_DETAIL_ASSERT(i < 255);
      ++i;
    }

    UNODB_DETAIL_ASSERT(this->children_count == basic_inode_16::capacity);
    UNODB_DETAIL_ASSERT(
        std::is_sorted(keys.byte_array.cbegin(),
                       keys.byte_array.cbegin() + basic_inode_16::capacity));
  }